

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestArray.cpp
# Opt level: O2

void testArray(void)

{
  code *pcVar1;
  int iVar2;
  int *piVar3;
  int local_4c;
  Array<int> local_48;
  Array<int> local_28;
  
  local_48._capacity = 0;
  local_28._capacity = 0;
  local_48._begin.item = (int *)0x0;
  local_48._end.item = (int *)0x0;
  local_28._begin.item = (int *)0x0;
  local_28._end.item = (int *)0x0;
  local_4c = 0x7b;
  piVar3 = Array<int>::append(&local_48,&local_4c);
  if ((*piVar3 == 0x7b) ||
     (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0xe,"myArray.append(123) == 123"), iVar2 == 0)) {
    local_4c = 0x7c;
    piVar3 = Array<int>::append(&local_48,&local_4c);
    if ((*piVar3 == 0x7c) ||
       (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                              ,0xf,"myArray.append(124) == 124"), iVar2 == 0)) {
      local_4c = 0x7d;
      piVar3 = Array<int>::append(&local_48,&local_4c);
      if ((((*piVar3 == 0x7d) ||
           (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                                  ,0x10,"myArray.append(125) == 125"), iVar2 == 0)) &&
          ((local_48._begin.item != local_48._end.item ||
           (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                                  ,0x11,"!myArray.isEmpty()"), iVar2 == 0)))) &&
         (((long)local_48._end.item - (long)local_48._begin.item == 0xc ||
          (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                                 ,0x12,"myArray.size() == 3"), iVar2 == 0)))) {
        if (local_48._begin.item != (int *)0x0) {
          local_48._end.item = local_48._begin.item;
        }
        if ((local_48._begin.item == local_48._end.item) ||
           ((iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                                   ,0x16,"myArray.isEmpty()"), iVar2 == 0 &&
            ((local_48._end.item == local_48._begin.item ||
             (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                                    ,0x17,"myArray.size() == 0"), iVar2 == 0)))))) {
          Array<int>::~Array(&local_28);
          Array<int>::~Array(&local_48);
          return;
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void testArray()
{
  // test append
  Array<int> myArray;
  Array<int> emptyArray;
  myArray.swap(emptyArray);
  ASSERT(myArray.isEmpty());
  ASSERT(myArray.size() == 0);
  ASSERT(myArray.append(123) == 123);
  ASSERT(myArray.append(124) == 124);
  ASSERT(myArray.append(125) == 125);
  ASSERT(!myArray.isEmpty());
  ASSERT(myArray.size() == 3);

  // tets clear
  myArray.clear();
  ASSERT(myArray.isEmpty());
  ASSERT(myArray.size() == 0);
}